

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O3

int main(int argc,char **argv)

{
  functest p_Var1;
  testDesc *ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  size_t sVar7;
  undefined8 extraout_RDX;
  long lVar8;
  code *pcVar9;
  code *pcVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  
  memset(filling,0x61,0x1000);
  filling[0x1000] = '\0';
  puVar6 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar6 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler);
  pcVar10 = hugeMatch;
  pcVar9 = hugeOpen;
  iVar3 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar3 < 0) {
    main_cold_2();
LAB_0010284f:
    main_cold_1();
    iVar3 = xmlMemUsed();
    iVar5 = xmlNoNetExternalEntityLoader(pcVar10,pcVar9,extraout_RDX);
    iVar4 = xmlMemUsed();
    extraMemoryFromResolver = extraMemoryFromResolver + (iVar4 - iVar3);
    return iVar5;
  }
  pcVar10 = crazyMatch;
  pcVar9 = crazyOpen;
  iVar3 = xmlRegisterInputCallbacks(crazyMatch,crazyOpen,crazyRead,crazyClose);
  if (iVar3 < 0) goto LAB_0010284f;
  if (1 < argc) {
    bVar15 = false;
    uVar14 = 1;
    do {
      pcVar13 = argv[uVar14];
      if (((*pcVar13 == '-') && (pcVar13[1] == 'v')) && (pcVar13[2] == '\0')) {
        verbose = '\x01';
      }
      else {
        iVar3 = strcmp(pcVar13,"-quiet");
        if (iVar3 == 0) {
          tests_quiet = '\x01';
        }
        else {
          iVar3 = strcmp(pcVar13,"-crazy");
          if (iVar3 == 0) {
            bVar15 = true;
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while ((uint)argc != uVar14);
    if (bVar15) goto LAB_00102655;
  }
  ptVar2 = testDescriptions;
  lVar8 = 0;
  do {
    iVar5 = nb_tests;
    iVar3 = nb_errors;
    if ((tests_quiet == '\0') && (testDescriptions[lVar8].desc != (char *)0x0)) {
      printf("## %s\n");
    }
    p_Var1 = ptVar2->func;
    lVar12 = 0;
    do {
      iVar4 = 0;
      if (lVar12 != 0x18 || lVar8 != 0) {
        iVar4 = *(int *)((long)&limitDescriptions[0].fail + lVar12);
      }
      iVar4 = (*p_Var1)(*(char **)((long)&limitDescriptions[0].name + lVar12),
                        *(size_t *)((long)&limitDescriptions[0].limit + lVar12),
                        *(int *)((long)&limitDescriptions[0].options + lVar12),iVar4);
      if (iVar4 != 0) {
        nb_errors = nb_errors + 1;
      }
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x120);
    if (verbose == '\x01') {
      if (nb_errors - iVar3 == 0) {
        printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar5));
      }
      else {
        printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar5),
               (ulong)(uint)(nb_errors - iVar3),0);
      }
    }
    lVar8 = lVar8 + 1;
    ptVar2 = testDescriptions + lVar8;
  } while (lVar8 != 2);
LAB_00102655:
  iVar5 = nb_tests;
  iVar3 = nb_errors;
  if (tests_quiet == '\0') {
    puts("## Crazy tests on reader");
  }
  pcVar13 = crazy;
  if (*crazy != '\0') {
    uVar11 = 1;
    uVar14 = 0;
    do {
      iVar4 = get_crazy_fail(uVar11 - 1);
      crazy_indx = uVar11 - 1;
      iVar4 = readerTest("crazy::test",0x988680,0,iVar4);
      if (iVar4 != 0) {
        nb_errors = nb_errors + 1;
      }
      if (tests_quiet == '\0') {
        fputc((int)crazy[uVar14],_stderr);
      }
      pcVar13 = crazy;
      uVar14 = (ulong)uVar11;
      sVar7 = strlen(crazy);
      uVar11 = uVar11 + 1;
    } while (uVar14 < sVar7);
  }
  if (tests_quiet == '\0') {
    puts("\n## Crazy tests on SAX");
    pcVar13 = crazy;
  }
  if (*pcVar13 != '\0') {
    uVar11 = 1;
    uVar14 = 0;
    do {
      iVar4 = get_crazy_fail(uVar11 - 1);
      crazy_indx = uVar11 - 1;
      iVar4 = saxTest("crazy::test",0x988680,0,iVar4);
      if (iVar4 != 0) {
        nb_errors = nb_errors + 1;
      }
      if (tests_quiet == '\0') {
        fputc((int)crazy[uVar14],_stderr);
      }
      uVar14 = (ulong)uVar11;
      sVar7 = strlen(crazy);
      uVar11 = uVar11 + 1;
    } while (uVar14 < sVar7);
  }
  if (tests_quiet == '\0') {
    fputc(10,_stderr);
  }
  if (verbose == '\x01') {
    if (nb_errors - iVar3 == 0) {
      printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar5));
    }
    else {
      printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar5),
             (ulong)(uint)(nb_errors - iVar3),0);
    }
  }
  bVar15 = nb_errors == 0;
  if (bVar15) {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,0);
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return (uint)!bVar15;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    fillFilling();
    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "-crazy"))
	    subset = 1;
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    ret += runcrazy();
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(ret);
}